

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# npbminput.cc
# Opt level: O2

int __thiscall NpbmInput::open(NpbmInput *this,char *__file,int __oflag,...)

{
  istream *piVar1;
  ImageSpec *pIVar2;
  
  if ((this->super_ImageInput).isp != (istream *)0x0) {
    std::__cxx11::string::assign((char *)&this->currentLine);
    this->pos = 0;
    piVar1 = (this->super_ImageInput).isp;
    std::ios::exceptions((int)piVar1 + (int)*(undefined8 *)(*(long *)piVar1 + -0x18));
    readImageHeaders(this);
    seekSubimage(this,0,0);
    pIVar2 = ImageSpec::operator=
                       ((ImageSpec *)__file,
                        (ImageSpec *)
                        ((ulong)(this->super_ImageInput).curSubimage * 0x90 +
                        *(long *)&(this->super_ImageInput).images));
    return (int)pIVar2;
  }
  __assert_fail("isp != nullptr && \"istream not initialized\"",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/npbm.imageio/npbminput.cc"
                ,0x5d,"virtual void NpbmInput::open(ImageSpec &)");
}

Assistant:

void
NpbmInput::open(ImageSpec& newspec)
{
    assert(isp != nullptr && "istream not initialized");
    currentLine = "";
    pos         = 0;

    isp->exceptions(std::istream::failbit | std::istream::badbit | std::istream::eofbit );
    readImageHeaders();
    seekSubimage(0);
    newspec = spec();
}